

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringconverter.cpp
# Opt level: O2

int QUtf8::compareUtf8(QByteArrayView utf8,QStringView utf16,CaseSensitivity cs)

{
  storage_type_conflict *psVar1;
  storage_type_conflict *psVar2;
  undefined1 auVar3 [16];
  qchar8_t b;
  storage_type_conflict sVar4;
  storage_type_conflict sVar5;
  ushort uVar6;
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  unkuint9 Var14;
  undefined1 auVar15 [11];
  undefined1 auVar16 [13];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  char32_t ucs4;
  long lVar19;
  qsizetype qVar20;
  uint uVar21;
  storage_type_conflict *psVar22;
  long *plVar23;
  storage_type_conflict *psVar24;
  sbyte sVar25;
  char32_t ucs4_00;
  qchar8_t *pqVar26;
  undefined4 in_register_00000084;
  longlong lVar27;
  longlong in_R9;
  qchar8_t *end;
  int iVar28;
  long lVar29;
  long in_FS_OFFSET;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  __m128i data8;
  __m128i data8_00;
  __m128i data16;
  __m128i data16_00;
  qchar8_t *src1;
  char32_t *output;
  long *local_50;
  char32_t local_44;
  long local_40;
  long local_38;
  long *extraout_RDX;
  
  lVar27 = CONCAT44(in_register_00000084,cs);
  src1 = (qchar8_t *)utf8.m_data;
  psVar22 = utf16.m_data;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  end = src1 + utf8.m_size;
  psVar1 = psVar22 + utf16.m_size;
  do {
    lVar29 = (long)psVar1 - (long)psVar22 >> 1;
    if ((long)end - (long)src1 < lVar29) {
      lVar29 = (long)end - (long)src1;
    }
    lVar19 = 0;
    do {
      local_40 = lVar19;
      if (lVar29 <= local_40 + 0x10) {
        local_44 = L'\0';
LAB_00151e68:
        sVar25 = 1;
        goto LAB_00151e6b;
      }
      auVar3 = *(undefined1 (*) [16])(src1 + local_40);
      psVar2 = psVar22 + local_40;
      psVar24 = psVar22 + local_40 + 8;
      auVar7[0xd] = 0;
      auVar7._0_13_ = auVar3._0_13_;
      auVar7[0xe] = auVar3[7];
      auVar8[0xc] = auVar3[6];
      auVar8._0_12_ = auVar3._0_12_;
      auVar8._13_2_ = auVar7._13_2_;
      auVar9[0xb] = 0;
      auVar9._0_11_ = auVar3._0_11_;
      auVar9._12_3_ = auVar8._12_3_;
      auVar10[10] = auVar3[5];
      auVar10._0_10_ = auVar3._0_10_;
      auVar10._11_4_ = auVar9._11_4_;
      auVar11[9] = 0;
      auVar11._0_9_ = auVar3._0_9_;
      auVar11._10_5_ = auVar10._10_5_;
      auVar12[8] = auVar3[4];
      auVar12._0_8_ = auVar3._0_8_;
      auVar12._9_6_ = auVar11._9_6_;
      auVar13._7_8_ = 0;
      auVar13._0_7_ = auVar12._8_7_;
      Var14 = CONCAT81(SUB158(auVar13 << 0x40,7),auVar3[3]);
      auVar17._9_6_ = 0;
      auVar17._0_9_ = Var14;
      auVar15._1_10_ = SUB1510(auVar17 << 0x30,5);
      auVar15[0] = auVar3[2];
      auVar18._11_4_ = 0;
      auVar18._0_11_ = auVar15;
      auVar16._1_12_ = SUB1512(auVar18 << 0x20,3);
      auVar16[0] = auVar3[1];
      auVar31._0_2_ = -(ushort)((ushort)auVar3[0] == *psVar2);
      auVar31._2_2_ = -(ushort)(auVar16._0_2_ == psVar2[1]);
      auVar31._4_2_ = -(ushort)(auVar15._0_2_ == psVar2[2]);
      auVar31._6_2_ = -(ushort)((storage_type_conflict)Var14 == psVar2[3]);
      auVar31._8_2_ = -(ushort)(auVar12._8_2_ == psVar2[4]);
      auVar31._10_2_ = -(ushort)(auVar10._10_2_ == psVar2[5]);
      auVar31._12_2_ = -(ushort)(auVar8._12_2_ == psVar2[6]);
      auVar31._14_2_ = -(ushort)((storage_type_conflict)(auVar7._13_2_ >> 8) == psVar2[7]);
      auVar30._0_2_ = -(ushort)((ushort)auVar3[8] == *psVar24);
      auVar30._2_2_ = -(ushort)((ushort)auVar3[9] == psVar24[1]);
      auVar30._4_2_ = -(ushort)((ushort)auVar3[10] == psVar24[2]);
      auVar30._6_2_ = -(ushort)((ushort)auVar3[0xb] == psVar24[3]);
      auVar30._8_2_ = -(ushort)((ushort)auVar3[0xc] == psVar24[4]);
      auVar30._10_2_ = -(ushort)((ushort)auVar3[0xd] == psVar24[5]);
      auVar30._12_2_ = -(ushort)((ushort)auVar3[0xe] == psVar24[6]);
      auVar30._14_2_ = -(ushort)((ushort)auVar3[0xf] == psVar24[7]);
      uVar21 = CONCAT22((ushort)(SUB161(auVar30 >> 7,0) & 1) |
                        (ushort)(SUB161(auVar30 >> 0xf,0) & 1) << 1 |
                        (ushort)(SUB161(auVar30 >> 0x17,0) & 1) << 2 |
                        (ushort)(SUB161(auVar30 >> 0x1f,0) & 1) << 3 |
                        (ushort)(SUB161(auVar30 >> 0x27,0) & 1) << 4 |
                        (ushort)(SUB161(auVar30 >> 0x2f,0) & 1) << 5 |
                        (ushort)(SUB161(auVar30 >> 0x37,0) & 1) << 6 |
                        (ushort)(SUB161(auVar30 >> 0x3f,0) & 1) << 7 |
                        (ushort)(SUB161(auVar30 >> 0x47,0) & 1) << 8 |
                        (ushort)(SUB161(auVar30 >> 0x4f,0) & 1) << 9 |
                        (ushort)(SUB161(auVar30 >> 0x57,0) & 1) << 10 |
                        (ushort)(SUB161(auVar30 >> 0x5f,0) & 1) << 0xb |
                        (ushort)(SUB161(auVar30 >> 0x67,0) & 1) << 0xc |
                        (ushort)(SUB161(auVar30 >> 0x6f,0) & 1) << 0xd |
                        (ushort)((byte)(auVar30._14_2_ >> 7) & 1) << 0xe | auVar30._14_2_ & 0x8000,
                        (ushort)(SUB161(auVar31 >> 7,0) & 1) |
                        (ushort)(SUB161(auVar31 >> 0xf,0) & 1) << 1 |
                        (ushort)(SUB161(auVar31 >> 0x17,0) & 1) << 2 |
                        (ushort)(SUB161(auVar31 >> 0x1f,0) & 1) << 3 |
                        (ushort)(SUB161(auVar31 >> 0x27,0) & 1) << 4 |
                        (ushort)(SUB161(auVar31 >> 0x2f,0) & 1) << 5 |
                        (ushort)(SUB161(auVar31 >> 0x37,0) & 1) << 6 |
                        (ushort)(SUB161(auVar31 >> 0x3f,0) & 1) << 7 |
                        (ushort)(SUB161(auVar31 >> 0x47,0) & 1) << 8 |
                        (ushort)(SUB161(auVar31 >> 0x4f,0) & 1) << 9 |
                        (ushort)(SUB161(auVar31 >> 0x57,0) & 1) << 10 |
                        (ushort)(SUB161(auVar31 >> 0x5f,0) & 1) << 0xb |
                        (ushort)(SUB161(auVar31 >> 0x67,0) & 1) << 0xc |
                        (ushort)(SUB161(auVar31 >> 0x6f,0) & 1) << 0xd |
                        (ushort)((byte)(auVar31._14_2_ >> 7) & 1) << 0xe | auVar31._14_2_ & 0x8000);
      if (uVar21 != 0xffffffff) {
        local_44 = ~uVar21;
        goto LAB_00151e68;
      }
      uVar6 = (ushort)(SUB161(auVar3 >> 7,0) & 1) | (ushort)(SUB161(auVar3 >> 0xf,0) & 1) << 1 |
              (ushort)(SUB161(auVar3 >> 0x17,0) & 1) << 2 |
              (ushort)(SUB161(auVar3 >> 0x1f,0) & 1) << 3 |
              (ushort)(SUB161(auVar3 >> 0x27,0) & 1) << 4 |
              (ushort)(SUB161(auVar3 >> 0x2f,0) & 1) << 5 |
              (ushort)(SUB161(auVar3 >> 0x37,0) & 1) << 6 |
              (ushort)(SUB161(auVar3 >> 0x3f,0) & 1) << 7 |
              (ushort)(SUB161(auVar3 >> 0x47,0) & 1) << 8 |
              (ushort)(SUB161(auVar3 >> 0x4f,0) & 1) << 9 |
              (ushort)(SUB161(auVar3 >> 0x57,0) & 1) << 10 |
              (ushort)(SUB161(auVar3 >> 0x5f,0) & 1) << 0xb |
              (ushort)(SUB161(auVar3 >> 0x67,0) & 1) << 0xc |
              (ushort)(SUB161(auVar3 >> 0x6f,0) & 1) << 0xd |
              (ushort)(SUB161(auVar3 >> 0x77,0) & 1) << 0xe |
              (ushort)(byte)(auVar3[0xf] >> 7) << 0xf;
      lVar19 = local_40 + 0x10;
    } while (uVar6 == 0);
    local_44 = (char32_t)uVar6;
    sVar25 = 0;
LAB_00151e6b:
    output = &local_44;
    plVar23 = &local_40;
    local_50 = plVar23;
    if (((local_44 != L'\0') ||
        ((local_40 + 8 < lVar29 &&
         (data8[1] = local_40 + 8, data8[0] = (longlong)plVar23, data16[1] = in_R9,
         data16[0] = lVar27,
         simdCompareAscii::anon_class_16_2_4bac8600::operator()
                   ((anon_class_16_2_4bac8600 *)&output,8,data8,data16), plVar23 = extraout_RDX,
         local_44 != L'\0')))) ||
       ((lVar19 = local_40, local_40 + 4 < lVar29 &&
        (data8_00[1] = (longlong)src1, data8_00[0] = (longlong)plVar23, data16_00[1] = in_R9,
        data16_00[0] = lVar27,
        simdCompareAscii::anon_class_16_2_4bac8600::operator()
                  ((anon_class_16_2_4bac8600 *)&output,4,data8_00,data16_00), lVar19 = local_40,
        local_44 != L'\0')))) {
      uVar21 = 0;
      if (local_44 != L'\0') {
        for (; ((uint)local_44 >> uVar21 & 1) == 0; uVar21 = uVar21 + 1) {
        }
      }
      lVar19 = local_40 + (ulong)(uVar21 >> sVar25);
    }
    psVar24 = psVar22 + lVar19;
    pqVar26 = src1 + lVar19;
    psVar22 = psVar24;
    src1 = pqVar26;
    if ((pqVar26 < end) && (psVar24 < psVar1)) {
      src1 = pqVar26 + 1;
      b = *pqVar26;
      local_40 = CONCAT44(local_40._4_4_,(uint)b);
      psVar22 = psVar24 + 1;
      sVar4 = *psVar24;
      ucs4_00 = (char32_t)(ushort)sVar4;
      ucs4 = (uint)b;
      if ((char)b < '\0') {
        output = (char32_t *)&local_40;
        qVar20 = QUtf8Functions::fromUtf8<QUtf8BaseTraitsNoAscii,char32_t*,qchar8_t_const*>
                           (b,&output,&src1,end);
        if (qVar20 < 0) {
          local_40 = CONCAT44(local_40._4_4_,0xfffd);
        }
        if ((psVar22 < psVar1 && (sVar4 & 0xfc00U) == 0xd800) &&
           (sVar5 = *psVar22, ((ushort)sVar5 & 0xfc00) == 0xdc00)) {
          psVar22 = psVar24 + 2;
          ucs4_00 = (uint)(ushort)sVar4 * 0x400 + (uint)(ushort)sVar5 + L'\xfca02400';
        }
        ucs4 = (char32_t)local_40;
      }
      if (cs == CaseInsensitive) {
        ucs4 = QChar::toCaseFolded(ucs4);
        ucs4_00 = QChar::toCaseFolded(ucs4_00);
      }
      iVar28 = ucs4 - ucs4_00;
      if (iVar28 != 0) goto LAB_0015203b;
    }
  } while ((src1 < end) && (psVar22 < psVar1));
  iVar28 = (uint)(src1 < end) - (uint)(psVar22 < psVar1);
LAB_0015203b:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar28;
}

Assistant:

int QUtf8::compareUtf8(QByteArrayView utf8, QStringView utf16, Qt::CaseSensitivity cs) noexcept
{
    auto src1 = reinterpret_cast<const qchar8_t *>(utf8.data());
    auto end1 = src1 + utf8.size();
    auto src2 = reinterpret_cast<const char16_t *>(utf16.data());
    auto end2 = src2 + utf16.size();

    do {
        simdCompareAscii(src1, end1, src2, end2);

        if (src1 < end1 && src2 < end2) {
            char32_t uc1 = *src1++;
            char32_t uc2 = *src2++;

            if (uc1 >= 0x80) {
                char32_t *output = &uc1;
                qsizetype res = QUtf8Functions::fromUtf8<QUtf8BaseTraitsNoAscii>(uc1, output, src1, end1);
                if (res < 0) {
                    // decoding error
                    uc1 = QChar::ReplacementCharacter;
                }

                // Only decode the UTF-16 surrogate pair if the UTF-8 code point
                // wasn't US-ASCII (a surrogate cannot match US-ASCII).
                if (QChar::isHighSurrogate(uc2) && src2 < end2 && QChar::isLowSurrogate(*src2))
                    uc2 = QChar::surrogateToUcs4(uc2, *src2++);
            }
            if (cs == Qt::CaseInsensitive) {
                uc1 = QChar::toCaseFolded(uc1);
                uc2 = QChar::toCaseFolded(uc2);
            }
            if (uc1 != uc2)
                return int(uc1) - int(uc2);
        }
    } while (src1 < end1 && src2 < end2);

    // the shorter string sorts first
    return (end1 > src1) - int(end2 > src2);
}